

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall glcts::anon_unknown_0::Uniform::streamDefinition(Uniform *this,ostringstream *str)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,
                           (string *)&(this->type).strType);
  poVar1 = std::operator<<(poVar1," ");
  std::operator<<(poVar1,(string *)&this->shortName);
  UniformType::streamArrayStr(&this->type,str,-1);
  return;
}

Assistant:

void streamDefinition(std::ostringstream& str) const
	{
		str << type.str() << " " << shortName;
		type.streamArrayStr(str);
	}